

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

int QMessageBoxPrivate::showOldMessageBox
              (QWidget *parent,Icon icon,QString *title,QString *text,QString *button0Text,
              QString *button1Text,QString *button2Text,int defaultButtonNumber,
              int escapeButtonNumber)

{
  long lVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  undefined8 uVar4;
  qsizetype qVar5;
  QPushButton *button;
  QAbstractButton *button_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  QMessageBox messageBox;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  messageBox.super_QDialog.super_QWidget.data = (QWidgetData *)&DAT_aaaaaaaaaaaaaaaa;
  messageBox.super_QDialog.super_QWidget._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  messageBox.super_QDialog.super_QWidget._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  messageBox.super_QDialog.super_QWidget._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  messageBox.super_QDialog.super_QWidget._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QMessageBox::QMessageBox
            (&messageBox,icon,title,text,(StandardButtons)0x0,parent,(WindowFlags)0x103);
  local_78.d = (button0Text->d).d;
  local_78.ptr = (button0Text->d).ptr;
  local_78.size = (button0Text->d).size;
  if (local_78.d != (Data *)0x0) {
    LOCK();
    ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_78.size == 0) {
    QDialogButtonBox::tr((QString *)&local_98,"OK",(char *)0x0,-1);
    pcVar3 = local_78.ptr;
    pDVar2 = local_78.d;
    local_78.d = local_98.d;
    local_78.ptr = local_98.ptr;
    local_98.d = pDVar2;
    local_98.ptr = pcVar3;
    local_78.size = local_98.size;
    local_98.size = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  }
  QMessageBox::addButton(&messageBox,(QString *)&local_78,ActionRole);
  if ((button1Text->d).size != 0) {
    QMessageBox::addButton(&messageBox,button1Text,ActionRole);
  }
  if ((button2Text->d).size != 0) {
    QMessageBox::addButton(&messageBox,button2Text,ActionRole);
  }
  uVar4 = messageBox.super_QDialog.super_QWidget._8_8_;
  if ((ulong)(long)defaultButtonNumber <
      *(ulong *)(messageBox.super_QDialog.super_QWidget._8_8_ + 0x310)) {
    button = *(QPushButton **)
              (*(long *)(messageBox.super_QDialog.super_QWidget._8_8_ + 0x308) +
              (long)defaultButtonNumber * 8);
  }
  else {
    button = (QPushButton *)0x0;
  }
  QMessageBox::setDefaultButton(&messageBox,button);
  if ((ulong)(long)escapeButtonNumber < *(ulong *)(uVar4 + 0x310)) {
    button_00 = *(QAbstractButton **)(*(long *)(uVar4 + 0x308) + (long)escapeButtonNumber * 8);
  }
  else {
    button_00 = (QAbstractButton *)0x0;
  }
  QMessageBox::setEscapeButton(&messageBox,button_00);
  QDialog::exec(&messageBox.super_QDialog);
  local_98.d = *(Data **)(messageBox.super_QDialog.super_QWidget._8_8_ + 0x330);
  qVar5 = QtPrivate::indexOf<QAbstractButton*,QAbstractButton*>
                    ((QList<QAbstractButton_*> *)(uVar4 + 0x300),(QAbstractButton **)&local_98,0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QMessageBox::~QMessageBox(&messageBox);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)qVar5;
  }
  __stack_chk_fail();
}

Assistant:

int QMessageBoxPrivate::showOldMessageBox(QWidget *parent, QMessageBox::Icon icon,
                                            const QString &title, const QString &text,
                                            const QString &button0Text,
                                            const QString &button1Text,
                                            const QString &button2Text,
                                            int defaultButtonNumber,
                                            int escapeButtonNumber)
{
    QMessageBox messageBox(icon, title, text, QMessageBox::NoButton, parent);
    QString myButton0Text = button0Text;
    if (myButton0Text.isEmpty())
        myButton0Text = QDialogButtonBox::tr("OK");
    messageBox.addButton(myButton0Text, QMessageBox::ActionRole);
    if (!button1Text.isEmpty())
        messageBox.addButton(button1Text, QMessageBox::ActionRole);
    if (!button2Text.isEmpty())
        messageBox.addButton(button2Text, QMessageBox::ActionRole);

    const QList<QAbstractButton *> &buttonList = messageBox.d_func()->customButtonList;
    messageBox.setDefaultButton(static_cast<QPushButton *>(buttonList.value(defaultButtonNumber)));
    messageBox.setEscapeButton(buttonList.value(escapeButtonNumber));

    messageBox.exec();

    // Ignore exec return value and use button index instead,
    // as that's what the documentation promises.
    return buttonList.indexOf(messageBox.clickedButton());
}